

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::sizeToText
               (XMLSize_t toFormat,char *toFill,XMLSize_t maxChars,uint radix,MemoryManager *manager
               )

{
  IllegalArgumentException *pIVar1;
  RuntimeException *this;
  long local_f0;
  XMLSize_t outIndex;
  XMLSize_t charInd_1;
  XMLSize_t charInd;
  char tmpBuf [128];
  ulong local_50;
  XMLSize_t tmpVal;
  XMLSize_t tmpIndex;
  MemoryManager *manager_local;
  uint radix_local;
  XMLSize_t maxChars_local;
  char *toFill_local;
  XMLSize_t toFormat_local;
  
  if (maxChars == 0) {
    pIVar1 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
    IllegalArgumentException::IllegalArgumentException
              (pIVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0x61,Str_ZeroSizedTargetBuf,manager);
    __cxa_throw(pIVar1,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  if (toFormat == 0) {
    *toFill = '0';
    toFill[1] = '\0';
  }
  else {
    tmpVal = 0;
    local_50 = toFormat;
    if (radix == 2) {
      for (; local_50 != 0; local_50 = local_50 >> 1) {
        if ((local_50 & 1) == 0) {
          tmpBuf[tmpVal - 8] = '0';
        }
        else {
          tmpBuf[tmpVal - 8] = '1';
        }
        tmpVal = tmpVal + 1;
      }
    }
    else if (radix == 0x10) {
      for (; local_50 != 0; local_50 = local_50 >> 4) {
        charInd_1 = local_50 & 0xf;
        tmpBuf[tmpVal - 8] = "0123456789ABCDEF"[charInd_1];
        tmpVal = tmpVal + 1;
      }
    }
    else {
      if ((radix != 8) && (radix != 10)) {
        this = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
                   ,0x9c,Str_UnknownRadix,manager);
        __cxa_throw(this,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      for (; local_50 != 0; local_50 = local_50 / radix) {
        tmpBuf[tmpVal - 8] = "0123456789ABCDEF"[local_50 % (ulong)radix];
        tmpVal = tmpVal + 1;
      }
    }
    if (maxChars < tmpVal) {
      pIVar1 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
      IllegalArgumentException::IllegalArgumentException
                (pIVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
                 ,0xa2,Str_TargetBufTooSmall,manager);
      __cxa_throw(pIVar1,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    local_f0 = 0;
    for (; tmpVal != 0; tmpVal = tmpVal - 1) {
      toFill[local_f0] = *(char *)((long)&charInd_1 + tmpVal + 7);
      local_f0 = local_f0 + 1;
    }
    toFill[local_f0] = '\0';
  }
  return;
}

Assistant:

void XMLString::sizeToText(  const  XMLSize_t           toFormat
                            ,       char* const          toFill
                            , const XMLSize_t            maxChars
                            , const unsigned int         radix
                            , MemoryManager* const       manager)
{
    static const char digitList[16] =
    {
          '0', '1', '2', '3', '4', '5', '6', '7', '8', '9'
        , 'A', 'B', 'C', 'D', 'E', 'F'
    };

    if (!maxChars)
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_ZeroSizedTargetBuf, manager);

    // Handle special case
    if (!toFormat)
    {
        toFill[0] = '0';
        toFill[1] = 0;
        return;
    }

    // This is used to fill the temp buffer
    XMLSize_t tmpIndex = 0;

    // A copy of the conversion value that we can modify
    XMLSize_t tmpVal = toFormat;

    //
    //  Convert into a temp buffer that we know is large enough. This avoids
    //  having to check for overflow in the inner loops, and we have to flip
    //  the resulting XMLString anyway.
    //
    char   tmpBuf[128];

    //
    //  For each radix, do the optimal thing. For bin and hex, we can special
    //  case them and do shift and mask oriented stuff. For oct and decimal
    //  there isn't much to do but bull through it with divides.
    //
    if (radix == 2)
    {
        while (tmpVal)
        {
            if (tmpVal & 0x1UL)
                tmpBuf[tmpIndex++] = '1';
            else
                tmpBuf[tmpIndex++] = '0';
            tmpVal >>= 1;
        }
    }
     else if (radix == 16)
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal & 0xFUL);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal >>= 4;
        }
    }
     else if ((radix == 8) || (radix == 10))
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal % radix);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal /= radix;
        }
    }
    else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Str_UnknownRadix, manager);
    }

    // See if have enough room in the caller's buffer
    if (tmpIndex > maxChars)
    {
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_TargetBufTooSmall, manager);
    }

    // Reverse the tmp buffer into the caller's buffer
    XMLSize_t outIndex = 0;
    for (; tmpIndex > 0; tmpIndex--)
        toFill[outIndex++] = tmpBuf[tmpIndex-1];

    // And cap off the caller's buffer
    toFill[outIndex] = char(0);
}